

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O2

char * Abc_NamReportUnique(Vec_Int_t *vNameIds1,Abc_Nam_t *p1,Abc_Nam_t *p2)

{
  int NameId;
  int iVar1;
  char *pcVar2;
  int i;
  
  i = 0;
  while( true ) {
    if (vNameIds1->nSize <= i) {
      return (char *)0x0;
    }
    NameId = Vec_IntEntry(vNameIds1,i);
    if ((NameId < 1) || ((p1->vInt2Handle).nSize <= NameId)) break;
    pcVar2 = Abc_NamStr(p1,NameId);
    iVar1 = Abc_NamStrFind(p2,pcVar2);
    i = i + 1;
    if (iVar1 == 0) {
      pcVar2 = Abc_NamStr(p1,NameId);
      return pcVar2;
    }
  }
  __assert_fail("Entry > 0 && Entry < Abc_NamObjNumMax(p1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilNam.c"
                ,0x24d,"char *Abc_NamReportUnique(Vec_Int_t *, Abc_Nam_t *, Abc_Nam_t *)");
}

Assistant:

char * Abc_NamReportUnique( Vec_Int_t * vNameIds1, Abc_Nam_t * p1, Abc_Nam_t * p2 )
{
    int i, Entry;
    Vec_IntForEachEntry( vNameIds1, Entry, i )
    {
        assert( Entry > 0 && Entry < Abc_NamObjNumMax(p1) );
        if ( Abc_NamStrFind(p2, Abc_NamStr(p1, Entry)) == 0 )
            return Abc_NamStr(p1, Entry);
    }
    return NULL;
}